

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.h
# Opt level: O2

void __thiscall bloaty::RollupOutput::RollupOutput(RollupOutput *this)

{
  allocator<char> local_31;
  string local_30;
  
  (this->source_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->source_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->source_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"TOTAL",&local_31);
  RollupRow::RollupRow(&this->toplevel_row_,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->disassembly_)._M_dataplus._M_p = (pointer)&(this->disassembly_).field_2;
  (this->disassembly_)._M_string_length = 0;
  (this->disassembly_).field_2._M_local_buf[0] = '\0';
  this->diff_mode_ = false;
  return;
}

Assistant:

RollupOutput() : toplevel_row_("TOTAL") {}